

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncCastEmulation.cpp
# Opt level: O3

Name __thiscall
wasm::FuncCastEmulation::makeThunk(FuncCastEmulation *this,Name name,Module *module,Index numParams)

{
  pointer *ppTVar1;
  undefined8 *puVar2;
  MixedArena *pMVar3;
  Name name_00;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> module_00;
  undefined8 *puVar4;
  Function *pFVar5;
  pointer pTVar6;
  Type *pTVar7;
  Expression *pEVar8;
  char *pcVar9;
  pointer pTVar10;
  Id IVar11;
  string_view sVar12;
  Signature SVar13;
  Name NVar14;
  Name name_01;
  undefined1 auStack_268 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> callOperands;
  HeapType local_d8;
  Type local_d0;
  uintptr_t local_c8;
  char *local_c0;
  size_t local_b8;
  char *local_b0;
  Expression local_a8;
  long local_98;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_90;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> thunkFunc;
  Tuple local_78;
  undefined1 auStack_58 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> thunkParams;
  
  pcVar9 = name.super_IString.str._M_str;
  auStack_58 = (undefined1  [8])
               &thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"byn$fpcast-emu$","");
  ppTVar1 = &local_78.types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_b8 = name.super_IString.str._M_len;
  local_78.types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppTVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,pcVar9,pcVar9 + name.super_IString.str._M_len);
  pTVar6 = (pointer)((long)&(thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                             ._M_impl.super__Vector_impl_data._M_start)->id +
                    (long)&(local_78.types.
                            super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                            super__Vector_impl_data._M_finish)->id);
  pTVar10 = (pointer)0xf;
  if (auStack_58 !=
      (undefined1  [8])
      &thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
       super__Vector_impl_data._M_finish) {
    pTVar10 = thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  local_b0 = pcVar9;
  if (pTVar10 < pTVar6) {
    pTVar10 = (pointer)0xf;
    if (local_78.types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppTVar1) {
      pTVar10 = local_78.types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    }
    if (pTVar6 <= pTVar10) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)auStack_58);
      goto LAB_006f0649;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append
                     (auStack_58,
                      (ulong)local_78.types.
                             super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                             super__Vector_impl_data._M_start);
LAB_006f0649:
  auStack_268 = (undefined1  [8])
                &callOperands.
                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
                 .super__Vector_impl_data._M_finish;
  puVar2 = puVar4 + 2;
  if ((pointer *)*puVar4 == (pointer *)puVar2) {
    callOperands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)*puVar2;
    callOperands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)puVar4[3];
  }
  else {
    callOperands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)*puVar2;
    auStack_268 = (undefined1  [8])*puVar4;
  }
  callOperands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)puVar4[1];
  *puVar4 = puVar2;
  puVar4[1] = 0;
  *(undefined1 *)puVar2 = 0;
  sVar12._M_str = (char *)0x0;
  sVar12._M_len = (size_t)auStack_268;
  sVar12 = IString::interned((IString *)
                             callOperands.
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_start,sVar12,SUB81(puVar2,0));
  NVar14.super_IString.str._M_str = (uintptr_t)sVar12._M_str;
  if (auStack_268 !=
      (undefined1  [8])
      &callOperands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
       _M_impl.super__Vector_impl_data._M_finish) {
    operator_delete((void *)auStack_268,
                    (long)callOperands.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 1);
  }
  if (local_78.types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)ppTVar1) {
    operator_delete(local_78.types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_78.types.
                                    super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->id + 1));
  }
  if (auStack_58 !=
      (undefined1  [8])
      &thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
       super__Vector_impl_data._M_finish) {
    operator_delete((void *)auStack_58,
                    (ulong)((long)&(thunkParams.
                                    super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_finish)->id + 1));
  }
  local_c0 = (char *)sVar12._M_len;
  pFVar5 = Module::getFunctionOrNull(module,(Name)sVar12);
  if (pFVar5 == (Function *)0x0) {
    name_00.super_IString.str._M_str = local_b0;
    name_00.super_IString.str._M_len = local_b8;
    pFVar5 = Module::getFunction(module,name_00);
    SVar13 = HeapType::getSignature(&pFVar5->type);
    local_c8 = (uintptr_t)SVar13.results.id;
    auStack_268 = (undefined1  [8])0x0;
    callOperands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    callOperands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    SVar13 = HeapType::getSignature(&pFVar5->type);
    local_78.types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)SVar13.params.id;
    thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    thunkFunc._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)module;
    auStack_58 = (undefined1  [8])&local_78;
    pTVar6 = (pointer)wasm::Type::size((Type *)&local_78);
    if ((thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
         super__Vector_impl_data._M_start != pTVar6) || (auStack_58 != (undefined1  [8])&local_78))
    {
      pMVar3 = (MixedArena *)
               ((long)thunkFunc._M_t.
                      super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                      .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x158);
      IVar11 = InvalidId;
      do {
        do {
          pTVar7 = wasm::Type::Iterator::operator*((Iterator *)auStack_58);
          pEVar8 = (Expression *)MixedArena::allocSpace(pMVar3,0x18,8);
          pEVar8->_id = LocalGetId;
          pEVar8[1]._id = IVar11;
          (pEVar8->type).id = 3;
          local_a8._0_8_ =
               fromABI(pEVar8,(Type)pTVar7->id,
                       (Module *)
                       thunkFunc._M_t.
                       super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_268,
                     (Expression **)&local_a8);
          thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((long)&(thunkParams.
                                 super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                                 .super__Vector_impl_data._M_start)->id + 1);
          IVar11 = IVar11 + BlockId;
        } while (thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_start != pTVar6);
      } while (auStack_58 != (undefined1  [8])&local_78);
    }
    module_00._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         thunkFunc._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
         _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    pMVar3 = (MixedArena *)
             ((long)thunkFunc._M_t.
                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
                    .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x158);
    pEVar8 = (Expression *)MixedArena::allocSpace(pMVar3,0x48,8);
    pEVar8->_id = CallId;
    *(undefined8 *)(pEVar8 + 1) = 0;
    pEVar8[1].type.id = 0;
    *(undefined8 *)(pEVar8 + 2) = 0;
    pEVar8[2].type.id = (uintptr_t)pMVar3;
    *(undefined1 *)&pEVar8[4]._id = InvalidId;
    (pEVar8->type).id = local_c8;
    *(size_t *)(pEVar8 + 3) = local_b8;
    pEVar8[3].type.id = (uintptr_t)local_b0;
    ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
    set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
              ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)(pEVar8 + 1),
               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_268);
    *(undefined1 *)&pEVar8[4]._id = InvalidId;
    auStack_58 = (undefined1  [8])0x0;
    thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (numParams != 0) {
      do {
        local_78.types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x3;
        if (thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start ==
            thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_58,
                     (iterator)
                     thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                     .super__Vector_impl_data._M_start,(Type *)&local_78);
        }
        else {
          (thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start)->id = 3;
          thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start =
               thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        numParams = numParams - 1;
      } while (numParams != 0);
    }
    Tuple::Tuple(&local_78,(TypeList *)auStack_58);
    wasm::Type::Type(&local_d0,&local_78);
    pcVar9 = local_c0;
    SVar13.results.id = 3;
    SVar13.params.id = local_d0.id;
    HeapType::HeapType(&local_d8,SVar13);
    local_a8._0_8_ = (Expression *)0x0;
    local_a8.type.id = 0;
    local_98 = 0;
    toABI(pEVar8,(Module *)
                 module_00._M_t.
                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                 super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    name_01.super_IString.str._M_str = pcVar9;
    name_01.super_IString.str._M_len = (size_t)&local_90;
    Builder::makeFunction
              (name_01,NVar14.super_IString.str._M_str,
               (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_d8.id,&local_a8);
    if ((Expression *)local_a8._0_8_ != (Expression *)0x0) {
      operator_delete((void *)local_a8._0_8_,local_98 - local_a8._0_8_);
    }
    if (local_78.types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.types.
                            super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.types.
                            super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    Module::addFunction((Module *)
                        module_00._M_t.
                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,&local_90);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_90);
    if (auStack_58 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_58,
                      (long)thunkParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
    }
    if (auStack_268 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_268,
                      (long)callOperands.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_268);
    }
    NVar14.super_IString.str._M_len = (size_t)pcVar9;
    return (Name)NVar14.super_IString.str;
  }
  Fatal::Fatal((Fatal *)auStack_268);
  Fatal::operator<<((Fatal *)auStack_268,
                    (char (*) [103])
                    "FuncCastEmulation::makeThunk seems a thunk name already in use. Was the pass already run on this code?"
                   );
  Fatal::~Fatal((Fatal *)auStack_268);
}

Assistant:

Name makeThunk(Name name, Module* module, Index numParams) {
    Name thunk = std::string("byn$fpcast-emu$") + name.toString();
    if (module->getFunctionOrNull(thunk)) {
      Fatal() << "FuncCastEmulation::makeThunk seems a thunk name already in "
                 "use. Was the pass already run on this code?";
    }
    // The item in the table may be a function or a function import.
    auto* func = module->getFunction(name);
    Type type = func->getResults();
    Builder builder(*module);
    std::vector<Expression*> callOperands;
    Index i = 0;
    for (const auto& param : func->getParams()) {
      callOperands.push_back(
        fromABI(builder.makeLocalGet(i++, Type::i64), param, module));
    }
    auto* call = builder.makeCall(name, callOperands, type);
    std::vector<Type> thunkParams;
    for (Index i = 0; i < numParams; i++) {
      thunkParams.push_back(Type::i64);
    }
    auto thunkFunc =
      builder.makeFunction(thunk,
                           Signature(Type(thunkParams), Type::i64),
                           {}, // no vars
                           toABI(call, module));
    module->addFunction(std::move(thunkFunc));
    return thunk;
  }